

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sup.c
# Opt level: O2

void supaddsym(toktdef *tab,char *txt,int styp,int sval,int casefold)

{
  _func_void_toktdef_ptr_char_ptr_int_int_int_int *p_Var1;
  uint uVar2;
  size_t sVar3;
  char buf [40];
  char acStack_58 [40];
  
  if (casefold != 0) {
    strcpy(acStack_58,txt);
    os_strlwr(acStack_58);
    txt = acStack_58;
  }
  p_Var1 = tab->toktfadd;
  sVar3 = strlen(txt);
  uVar2 = tokhsh(txt);
  (*p_Var1)(tab,txt,(int)sVar3,styp,sval,uVar2);
  return;
}

Assistant:

static void supaddsym(toktdef *tab, char *txt, int styp, int sval,
                      int casefold)
{
    char buf[40];

    if (casefold)
    {
        strcpy(buf, txt);
        os_strlwr(buf);
        txt = buf;
    }
    (*tab->toktfadd)(tab, txt, (int)strlen(txt), styp, sval, tokhsh(txt));
}